

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

void __thiscall tl::StrT<char>::StrT(StrT<char> *this,u32 size,char c)

{
  uint local_28;
  u32 i;
  char c_local;
  u32 size_local;
  StrT<char> *this_local;
  
  StrT(this);
  resizeNoCopy(this,size);
  for (local_28 = 0; local_28 < this->_size; local_28 = local_28 + 1) {
    this->_str[local_28] = c;
  }
  return;
}

Assistant:

StrT<CharT>::StrT(u32 size, CharT c)
    : StrT()
{
    resizeNoCopy(size);
    for(u32 i=0; i<_size; i++) {
        _str[i] = c;
    }
}